

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateManager.cpp
# Opt level: O0

void __thiscall
helics::ValueFederateManager::addAlias
          (ValueFederateManager *this,Publication *pub,string_view shortcutName)

{
  bool bVar1;
  undefined8 uVar2;
  InterfaceHandle *in_RCX;
  undefined8 in_RDX;
  basic_string_view<char,_std::char_traits<char>_> *in_RDI;
  __sv_type _Var3;
  handle pubHandle;
  Interface *this_00;
  char *in_stack_ffffffffffffff58;
  lock_handle<gmlc::containers::DualStringMappedVector<helics::Publication,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
  *this_01;
  string_view in_stack_ffffffffffffff68;
  shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Publication,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
  *in_stack_ffffffffffffff88;
  DualStringMappedVector<helics::Publication,_helics::InterfaceHandle,_(reference_stability)0,_5>
  *in_stack_ffffffffffffff98;
  string_view in_stack_ffffffffffffffa0;
  size_t local_30;
  char *local_28;
  
  bVar1 = Interface::isValid((Interface *)0x2dce31);
  if (!bVar1) {
    uVar2 = __cxa_allocate_exception(0x28);
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_RDI,in_stack_ffffffffffffff58);
    InvalidIdentifier::InvalidIdentifier((InvalidIdentifier *)in_RDI,in_stack_ffffffffffffff68);
    __cxa_throw(uVar2,&InvalidIdentifier::typeinfo,InvalidIdentifier::~InvalidIdentifier);
  }
  this_00 = (Interface *)in_RDI[0x20]._M_len;
  Interface::getName_abi_cxx11_(this_00);
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  local_30 = _Var3._M_len;
  local_28 = _Var3._M_str;
  (*this_00->_vptr_Interface[0x45])(this_00,local_30,local_28,in_RDX,in_RCX);
  this_01 = (lock_handle<gmlc::containers::DualStringMappedVector<helics::Publication,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
             *)&stack0xffffffffffffffa0;
  gmlc::libguarded::
  shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Publication,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
  ::lock(in_stack_ffffffffffffff88);
  gmlc::libguarded::
  lock_handle<gmlc::containers::DualStringMappedVector<helics::Publication,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
  ::operator->(this_01);
  gmlc::containers::
  DualStringMappedVector<helics::Publication,_helics::InterfaceHandle,_(reference_stability)0,_5>::
  addSearchTerm(in_stack_ffffffffffffff98,in_stack_ffffffffffffffa0,in_RCX);
  gmlc::libguarded::
  lock_handle<gmlc::containers::DualStringMappedVector<helics::Publication,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
  ::~lock_handle((lock_handle<gmlc::containers::DualStringMappedVector<helics::Publication,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
                  *)0x2dcf04);
  return;
}

Assistant:

void ValueFederateManager::addAlias(const Publication& pub, std::string_view shortcutName)
{
    if (pub.isValid()) {
        coreObject->addAlias(pub.getName(), shortcutName);
        auto pubHandle = publications.lock();
        pubHandle->addSearchTerm(shortcutName, pub.handle);
    } else {
        throw(InvalidIdentifier("publication is invalid"));
    }
}